

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psft.c
# Opt level: O3

FT_Error cf2_getT1SeacComponent(PS_Decoder *decoder,FT_UInt glyph_index,CF2_Buffer buf)

{
  undefined8 *puVar1;
  FT_Byte *pFVar2;
  int iVar3;
  long *plVar4;
  long local_20;
  uint local_18;
  
  puVar1 = *(undefined8 **)(decoder->stack[0x10] + 0x68);
  if (puVar1 == (undefined8 *)0x0) {
    plVar4 = (long *)(decoder->zones[6].base + (ulong)glyph_index * 8);
    local_18 = *(uint *)(decoder->zones[6].limit + (ulong)glyph_index * 4);
  }
  else {
    plVar4 = &local_20;
    iVar3 = (**(code **)*puVar1)(puVar1[1],glyph_index,plVar4);
    if (iVar3 != 0) {
      return iVar3;
    }
  }
  pFVar2 = (FT_Byte *)*plVar4;
  buf->error = (FT_Error *)0x0;
  buf->ptr = pFVar2;
  buf->start = pFVar2;
  buf->end = pFVar2 + local_18;
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cf2_getT1SeacComponent( PS_Decoder*  decoder,
                          FT_UInt      glyph_index,
                          CF2_Buffer   buf )
  {
    FT_Data   glyph_data;
    FT_Error  error = FT_Err_Ok;
    T1_Face   face  = (T1_Face)decoder->builder.face;
    T1_Font   type1 = &face->type1;

#ifdef FT_CONFIG_OPTION_INCREMENTAL
    FT_Incremental_InterfaceRec  *inc =
      face->root.internal->incremental_interface;


    /* For incremental fonts get the character data using the */
    /* callback function.                                     */
    if ( inc )
      error = inc->funcs->get_glyph_data( inc->object,
                                          glyph_index, &glyph_data );
    else
#endif
    /* For ordinary fonts get the character data stored in the face record. */
    {
      glyph_data.pointer = type1->charstrings[glyph_index];
      glyph_data.length  = type1->charstrings_len[glyph_index];
    }

    if ( !error )
    {
      FT_Byte*  charstring_base = (FT_Byte*)glyph_data.pointer;
      FT_ULong  charstring_len  = glyph_data.length;


      FT_ASSERT( charstring_base + charstring_len >= charstring_base );

      FT_ZERO( buf );
      buf->start =
      buf->ptr   = charstring_base;
      buf->end   = charstring_base + charstring_len;
    }

    return error;
  }